

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void duckdb_je_free_default(void *ptr)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  void *pvVar4;
  uint64_t uVar5;
  size_t __n;
  long lVar6;
  ushort uVar7;
  undefined8 uVar8;
  tsd_t *tsd;
  ulong uVar9;
  rtree_leaf_elm_t *prVar10;
  void **ppvVar11;
  uint uVar12;
  uintptr_t in_RCX;
  ulong *puVar13;
  cache_bin_t *pcVar14;
  long lVar15;
  uintptr_t in_R8;
  tcache_t *ptVar16;
  cache_bin_t *bin;
  rtree_metadata_t rVar17;
  rtree_ctx_t *rtree_ctx_1;
  uintptr_t args_raw [3];
  te_ctx_t local_78;
  rtree_t *local_50;
  void *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  if (ptr == (void *)0x0) {
    return;
  }
  tsd = (tsd_t *)__tls_get_addr(&PTR_02493488);
  if (((tsd->state).repr != '\0') &&
     (tsd = duckdb_je_tsd_fetch_slow(tsd,true), (tsd->state).repr != '\0')) {
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level == '\0') {
      ptVar16 = (tcache_t *)0x0;
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
        ptVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
      }
    }
    else {
      ptVar16 = (tcache_t *)0x0;
    }
    local_40 = 0;
    uStack_38 = 0;
    local_48 = ptr;
    duckdb_je_hook_invoke_dalloc(hook_dalloc_free,ptr,(uintptr_t *)&local_48);
    local_50 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    rVar17 = rtree_metadata_read((tsdn_t *)tsd,local_50,(rtree_ctx_t *)ptr,in_RCX);
    uVar12 = rVar17.szind;
    __n = duckdb_je_sz_index2size_tab[uVar12];
    if (duckdb_je_opt_junk_free == true) {
      switchD_01043a80::default(ptr,0x5a,__n);
    }
    if (ptVar16 == (tcache_t *)0x0) {
      arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
    }
    else if ((rVar17._8_4_ >> 8 & 1) == 0) {
      if ((uVar12 < ptVar16->tcache_slow->tcache_nbins) &&
         (ppvVar11 = ptVar16->bins[uVar12].stack_head, ppvVar11 != (void **)&duckdb_je_disabled_bin)
         ) {
        pcVar14 = ptVar16->bins + uVar12;
        if (ptVar16->bins[uVar12].low_bits_full == (uint16_t)ppvVar11) {
          duckdb_je_tcache_bin_flush_large
                    (tsd,ptVar16,pcVar14,uVar12,
                     (uint)(ptVar16->bins[uVar12].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
          ppvVar11 = pcVar14->stack_head;
          if (ptVar16->bins[uVar12].low_bits_full != (uint16_t)ppvVar11) goto LAB_01c27ea4;
        }
        else {
          pcVar14->stack_head = ppvVar11 + -1;
          ppvVar11[-1] = ptr;
        }
      }
      else {
        rtree_read((rtree_contents_t *)&local_78,(tsdn_t *)tsd,local_50,(rtree_ctx_t *)ptr,in_R8);
        duckdb_je_large_dalloc((tsdn_t *)tsd,(edata_t *)CONCAT71(local_78._1_7_,local_78.is_alloc));
      }
    }
    else {
      pcVar14 = ptVar16->bins + uVar12;
      ppvVar11 = pcVar14->stack_head;
      if (ptVar16->bins[uVar12].low_bits_full == (uint16_t)ppvVar11) {
        if (ppvVar11 == (void **)&duckdb_je_disabled_bin) {
          duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
        }
        else {
          duckdb_je_tcache_bin_flush_small
                    (tsd,ptVar16,pcVar14,uVar12,
                     (uint)(ptVar16->bins[uVar12].bin_info.ncached_max >>
                           ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
          ppvVar11 = pcVar14->stack_head;
          if (ptVar16->bins[uVar12].low_bits_full != (uint16_t)ppvVar11) goto LAB_01c27ea4;
        }
      }
      else {
LAB_01c27ea4:
        pcVar14->stack_head = ppvVar11 + -1;
        ppvVar11[-1] = ptr;
      }
    }
    uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar5 + __n;
    if (__n < tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
              uVar5) {
      return;
    }
    goto LAB_01c27f03;
  }
  uVar9 = (ulong)ptr & 0xffffffffc0000000;
  uVar12 = ((uint)((ulong)ptr >> 0x1e) & 0xf) << 4;
  puVar13 = (ulong *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                             cache[0].leafkey + (ulong)uVar12);
  uVar3 = *puVar13;
  if (uVar3 == uVar9) {
    prVar10 = (rtree_leaf_elm_t *)
              ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) +
              *(long *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
                               ).cache[0].leaf + (ulong)uVar12));
  }
  else if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
           leafkey == uVar9) {
    prVar10 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].
              leaf;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leafkey =
         uVar3;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).l2_cache[0].leaf =
         *(rtree_leaf_elm_t **)
          ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].
                  leaf + (ulong)uVar12);
    *puVar13 = uVar9;
    *(rtree_leaf_elm_t **)
     ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache[0].leaf +
     (ulong)uVar12) = prVar10;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    lVar15 = 0x2d0;
    do {
      if (*(ulong *)((long)tsd + lVar15 + -8) == uVar9) {
        lVar6 = *(long *)(&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                         + lVar15);
        puVar1 = (undefined8 *)((long)tsd + lVar15 + -0x18);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)tsd + lVar15 + -8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        *(ulong *)((long)tsd + lVar15 + -0x18) = uVar3;
        *(undefined8 *)((long)tsd + lVar15 + -0x10) =
             *(undefined8 *)
              ((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).cache
                      [0].leaf + (ulong)uVar12);
        *puVar13 = uVar9;
        *(long *)((long)&(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx).
                         cache[0].leaf + (ulong)uVar12) = lVar6;
        prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + lVar6);
        goto LAB_01c27d2c;
      }
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x340);
    in_R8 = 1;
    prVar10 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,
                         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
                         (uintptr_t)ptr,true,false);
  }
LAB_01c27d2c:
  ptVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
  pvVar4 = (prVar10->le_bits).repr;
  uVar9 = (ulong)pvVar4 >> 0x30;
  uVar3 = duckdb_je_sz_index2size_tab[uVar9];
  uVar7 = (ushort)((ulong)pvVar4 >> 0x30);
  if (((ulong)pvVar4 & 1) == 0) {
    if (((uint)uVar7 < ptVar16->tcache_slow->tcache_nbins) &&
       (ppvVar11 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar9].
                   stack_head, ppvVar11 != (void **)&duckdb_je_disabled_bin)) {
      pcVar14 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + uVar9;
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar9].
          low_bits_full == (uint16_t)ppvVar11) {
        duckdb_je_tcache_bin_flush_large
                  (tsd,ptVar16,pcVar14,(uint)uVar7,
                   (uint)((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins
                          [uVar9].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
        goto LAB_01c27fd7;
      }
      goto LAB_01c27d6e;
    }
    rtree_read((rtree_contents_t *)&local_78,(tsdn_t *)tsd,
               (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx,
               (rtree_ctx_t *)ptr,in_R8);
    duckdb_je_large_dalloc((tsdn_t *)tsd,(edata_t *)CONCAT71(local_78._1_7_,local_78.is_alloc));
  }
  else {
    pcVar14 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins + uVar9;
    ppvVar11 = pcVar14->stack_head;
    if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins[uVar9].
        low_bits_full == (uint16_t)ppvVar11) {
      if (ppvVar11 == (void **)&duckdb_je_disabled_bin) {
        duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
      }
      else {
        duckdb_je_tcache_bin_flush_small
                  (tsd,ptVar16,pcVar14,(uint)uVar7,
                   (uint)((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins
                          [uVar9].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01c27fd7:
        ppvVar11 = pcVar14->stack_head;
        if (pcVar14->low_bits_full != (uint16_t)ppvVar11) {
          pcVar14->stack_head = ppvVar11 + -1;
          ppvVar11[-1] = ptr;
        }
      }
    }
    else {
LAB_01c27d6e:
      pcVar14->stack_head = ppvVar11 + -1;
      ppvVar11[-1] = ptr;
    }
  }
  uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar5 + uVar3;
  if (uVar3 < tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
              uVar5) {
    return;
  }
LAB_01c27f03:
  local_78.next_event_fast =
       &tsd->
        cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast;
  local_78.next_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  local_78.last_event =
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  local_78.current = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  local_78.is_alloc = false;
  duckdb_je_te_event_trigger(tsd,&local_78);
  return;
}

Assistant:

JEMALLOC_NOINLINE
void
free_default(void *ptr) {
	UTRACE(ptr, 0, 0);
	if (likely(ptr != NULL)) {
		/*
		 * We avoid setting up tsd fully (e.g. tcache, arena binding)
		 * based on only free() calls -- other activities trigger the
		 * minimal to full transition.  This is because free() may
		 * happen during thread shutdown after tls deallocation: if a
		 * thread never had any malloc activities until then, a
		 * fully-setup tsd won't be destructed properly.
		 */
		tsd_t *tsd = tsd_fetch_min();
		check_entry_exit_locking(tsd_tsdn(tsd));

		if (likely(tsd_fast(tsd))) {
			tcache_t *tcache = tcache_get_from_ind(tsd,
			    TCACHE_IND_AUTOMATIC, /* slow */ false,
			    /* is_alloc */ false);
			ifree(tsd, ptr, tcache, /* slow */ false);
		} else {
			tcache_t *tcache = tcache_get_from_ind(tsd,
			    TCACHE_IND_AUTOMATIC, /* slow */ true,
			    /* is_alloc */ false);
			uintptr_t args_raw[3] = {(uintptr_t)ptr};
			hook_invoke_dalloc(hook_dalloc_free, ptr, args_raw);
			ifree(tsd, ptr, tcache, /* slow */ true);
		}

		check_entry_exit_locking(tsd_tsdn(tsd));
	}
}